

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

char * get_param_word(char **str,char **end_pos,char endchar)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char *local_48;
  char *escape;
  char *ptr2;
  char *word_begin;
  char *ptr;
  char endchar_local;
  char **end_pos_local;
  char **str_local;
  
  pcVar1 = *str;
  local_48 = (char *)0x0;
  pcVar2 = pcVar1;
  if (*pcVar1 == '\"') {
    word_begin = pcVar1 + 1;
    while (*word_begin != '\0') {
      if ((*word_begin == '\\') && ((word_begin[1] == '\\' || (word_begin[1] == '\"')))) {
        if (local_48 == (char *)0x0) {
          local_48 = word_begin;
        }
        word_begin = word_begin + 2;
      }
      else {
        if (*word_begin == '\"') {
          *end_pos = word_begin;
          if (local_48 != (char *)0x0) {
            escape = local_48;
            word_begin = local_48;
            do {
              if ((*word_begin == '\\') && ((word_begin[1] == '\\' || (word_begin[1] == '\"')))) {
                word_begin = word_begin + 1;
              }
              pcVar2 = word_begin + 1;
              pcVar3 = escape + 1;
              *escape = *word_begin;
              escape = pcVar3;
              word_begin = pcVar2;
            } while (pcVar2 < *end_pos);
            *end_pos = pcVar3;
          }
          while( true ) {
            bVar4 = false;
            if ((*word_begin != '\0') && (bVar4 = false, *word_begin != ';')) {
              bVar4 = *word_begin != endchar;
            }
            if (!bVar4) break;
            word_begin = word_begin + 1;
          }
          *str = word_begin;
          return pcVar1 + 1;
        }
        word_begin = word_begin + 1;
      }
    }
  }
  while( true ) {
    word_begin = pcVar2;
    bVar4 = false;
    if ((*word_begin != '\0') && (bVar4 = false, *word_begin != ';')) {
      bVar4 = *word_begin != endchar;
    }
    if (!bVar4) break;
    pcVar2 = word_begin + 1;
  }
  *end_pos = word_begin;
  *str = word_begin;
  return pcVar1;
}

Assistant:

static char *get_param_word(char **str, char **end_pos, char endchar)
{
  char *ptr = *str;
  /* the first non-space char is here */
  char *word_begin = ptr;
  char *ptr2;
  char *escape = NULL;

  if(*ptr == '"') {
    ++ptr;
    while(*ptr) {
      if(*ptr == '\\') {
        if(ptr[1] == '\\' || ptr[1] == '"') {
          /* remember the first escape position */
          if(!escape)
            escape = ptr;
          /* skip escape of back-slash or double-quote */
          ptr += 2;
          continue;
        }
      }
      if(*ptr == '"') {
        *end_pos = ptr;
        if(escape) {
          /* has escape, we restore the unescaped string here */
          ptr = ptr2 = escape;
          do {
            if(*ptr == '\\' && (ptr[1] == '\\' || ptr[1] == '"'))
              ++ptr;
            *ptr2++ = *ptr++;
          }
          while(ptr < *end_pos);
          *end_pos = ptr2;
        }
        while(*ptr && *ptr != ';' && *ptr != endchar)
          ++ptr;
        *str = ptr;
        return word_begin + 1;
      }
      ++ptr;
    }
    /* end quote is missing, treat it as non-quoted. */
    ptr = word_begin;
  }

  while(*ptr && *ptr != ';' && *ptr != endchar)
    ++ptr;
  *str = *end_pos = ptr;
  return word_begin;
}